

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invocation_interlock_placement_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::InvocationInterlockPlacementPass::placeInstructions
          (InvocationInterlockPlacementPass *this,BasicBlock *block)

{
  anon_class_24_3_52b084af local_58;
  function<void_(unsigned_int)> local_40;
  bool local_19;
  BasicBlock *pBStack_18;
  bool modified;
  BasicBlock *block_local;
  InvocationInterlockPlacementPass *this_local;
  
  local_19 = false;
  local_58.modified = &local_19;
  local_58.this = this;
  local_58.block = block;
  pBStack_18 = block;
  block_local = (BasicBlock *)this;
  std::function<void(unsigned_int)>::
  function<spvtools::opt::InvocationInterlockPlacementPass::placeInstructions(spvtools::opt::BasicBlock*)::__0,void>
            ((function<void(unsigned_int)> *)&local_40,&local_58);
  BasicBlock::ForEachSuccessorLabel(block,&local_40);
  std::function<void_(unsigned_int)>::~function(&local_40);
  return (bool)(local_19 & 1);
}

Assistant:

bool InvocationInterlockPlacementPass::placeInstructions(BasicBlock* block) {
  bool modified = false;

  block->ForEachSuccessorLabel([this, block, &modified](uint32_t succ_id) {
    modified |= placeInstructionsForEdge(
        block, succ_id, after_begin_, predecessors_after_begin_,
        spv::Op::OpBeginInvocationInterlockEXT, /* reverse_cfg= */ true);
    modified |= placeInstructionsForEdge(cfg()->block(succ_id), block->id(),
                                         before_end_, successors_before_end_,
                                         spv::Op::OpEndInvocationInterlockEXT,
                                         /* reverse_cfg= */ false);
  });

  return modified;
}